

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

mir_size_t get_object_path_offset(c2m_ctx_t c2m_ctx)

{
  anon_union_8_2_e4b0c9a5_for_u aVar1;
  ulong uVar2;
  int iVar3;
  size_t sVar4;
  mir_size_t mVar5;
  undefined1 local_50 [16];
  anon_union_8_2_e4b0c9a5_for_u local_40;
  ulong local_38;
  size_t i;
  size_t offset;
  init_object_t init_object;
  c2m_ctx_t c2m_ctx_local;
  
  i = 0;
  local_38 = 0;
  init_object.u = (anon_union_8_2_e4b0c9a5_for_u)c2m_ctx;
  do {
    uVar2 = local_38;
    sVar4 = VARR_init_object_tlength(*(VARR_init_object_t **)(init_object.u.curr_index + 0x1a8));
    if (sVar4 <= uVar2) {
      return i;
    }
    VARR_init_object_tget
              ((init_object_t *)local_50,*(VARR_init_object_t **)(init_object.u.curr_index + 0x1a8),
               local_38);
    aVar1 = local_40;
    offset = local_50._0_8_;
    init_object.container_type = (type *)local_50._8_8_;
    init_object._8_8_ = local_40;
    if (*(type_mode *)(local_50._0_8_ + 0x18) == TM_ARR) {
      mVar5 = type_size((c2m_ctx_t)init_object.u.curr_member,
                        ((anon_union_8_5_3fbb1736_for_u *)(local_50._0_8_ + 0x30))->ptr_type->
                        arr_type);
      i = aVar1.curr_index * mVar5 + i;
    }
    else {
      if ((*(type_mode *)(local_50._0_8_ + 0x18) != TM_STRUCT) &&
         (*(type_mode *)(local_50._0_8_ + 0x18) != TM_UNION)) {
        __assert_fail("init_object.container_type->mode == TM_STRUCT || init_object.container_type->mode == TM_UNION"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                      ,0x2caa,"mir_size_t get_object_path_offset(c2m_ctx_t)");
      }
      if ((local_40.curr_member)->code != N_MEMBER) {
        __assert_fail("init_object.u.curr_member->code == N_MEMBER",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                      ,0x2cab,"mir_size_t get_object_path_offset(c2m_ctx_t)");
      }
      iVar3 = anon_struct_union_type_member_p(local_40.curr_member);
      if (iVar3 == 0) {
        i = *(long *)(*(long *)(init_object._8_8_ + 8) + 0x10) + i;
      }
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

static mir_size_t get_object_path_offset (c2m_ctx_t c2m_ctx) {
  init_object_t init_object;
  size_t offset = 0;

  for (size_t i = 0; i < VARR_LENGTH (init_object_t, init_object_path); i++) {
    init_object = VARR_GET (init_object_t, init_object_path, i);
    if (init_object.container_type->mode == TM_ARR) {  // ??? index < 0
      offset += (init_object.u.curr_index
                 * type_size (c2m_ctx, init_object.container_type->u.arr_type->el_type));
    } else {
      assert (init_object.container_type->mode == TM_STRUCT
              || init_object.container_type->mode == TM_UNION);
      assert (init_object.u.curr_member->code == N_MEMBER);
      if (!anon_struct_union_type_member_p (init_object.u.curr_member))
        /* Members inside anon struct/union already have adjusted offset */
        offset += ((decl_t) init_object.u.curr_member->attr)->offset;
    }
  }
  return offset;
}